

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

Vec_Int_t * Gia_ManRequiredLevel(Gia_Man_t *p)

{
  int iVar1;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar2;
  bool bVar3;
  int local_28;
  int local_24;
  int LevelMax;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vRequired;
  Gia_Man_t *p_local;
  
  local_28 = 0;
  p_00 = Gia_ManReverseLevel(p);
  local_24 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCis);
    bVar3 = false;
    if (local_24 < iVar1) {
      _LevelMax = Gia_ManCi(p,local_24);
      bVar3 = _LevelMax != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    iVar1 = Gia_ObjId(p,_LevelMax);
    iVar1 = Vec_IntEntry(p_00,iVar1);
    local_28 = Abc_MaxInt(local_28,iVar1);
    local_24 = local_24 + 1;
  }
  local_24 = 0;
  while( true ) {
    bVar3 = false;
    if (local_24 < p->nObjs) {
      pGVar2 = Gia_ManObj(p,local_24);
      bVar3 = pGVar2 != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    iVar1 = Vec_IntEntry(p_00,local_24);
    Vec_IntWriteEntry(p_00,local_24,local_28 - iVar1);
    local_24 = local_24 + 1;
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManRequiredLevel( Gia_Man_t * p )  
{
    Vec_Int_t * vRequired;
    Gia_Obj_t * pObj;
    int i, LevelMax = 0;
    vRequired = Gia_ManReverseLevel( p );
    Gia_ManForEachCi( p, pObj, i )
        LevelMax = Abc_MaxInt( LevelMax, Vec_IntEntry(vRequired, Gia_ObjId(p, pObj)) );
    Gia_ManForEachObj( p, pObj, i )
        Vec_IntWriteEntry( vRequired, i, LevelMax - Vec_IntEntry(vRequired, i) );
    return vRequired;
}